

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::array<unsigned_long,_4UL>_&> * __thiscall
testing::internal::ElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_std::array<unsigned_long,_4UL>_&> *__return_storage_ptr__,
          ElementsAreArrayMatcher *this)

{
  ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&> *this_00;
  const_iterator first;
  const_iterator last;
  ElementsAreArrayMatcher<unsigned_long> *this_local;
  
  this_00 = (ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&> *)operator_new(0x20);
  first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this_00,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )first._M_current,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )last._M_current);
  Matcher<const_std::array<unsigned_long,_4UL>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::array<unsigned_long,_4UL>_&> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value,
        "use UnorderedElementsAreArray with hash tables");

    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers_.begin(), matchers_.end()));
  }